

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topic_manager.cpp
# Opt level: O2

void __thiscall miniros::TopicManager::getPublications(TopicManager *this,XmlRpcValue *pubs)

{
  __shared_ptr<miniros::Publication,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  XmlRpcValue *pXVar2;
  int i;
  __shared_ptr<miniros::Publication,_(__gnu_cxx::_Lock_policy)2> *p_Var3;
  PublicationPtr t;
  XmlRpcValue pub;
  XmlRpcValue local_40;
  
  i = 0;
  XmlRpc::XmlRpcValue::assertArray(pubs,0);
  std::recursive_mutex::lock(&this->advertised_topics_mutex_);
  p_Var1 = &((this->advertised_topics_).
             super__Vector_base<std::shared_ptr<miniros::Publication>,_std::allocator<std::shared_ptr<miniros::Publication>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->
            super___shared_ptr<miniros::Publication,_(__gnu_cxx::_Lock_policy)2>;
  for (p_Var3 = &((this->advertised_topics_).
                  super__Vector_base<std::shared_ptr<miniros::Publication>,_std::allocator<std::shared_ptr<miniros::Publication>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                 super___shared_ptr<miniros::Publication,_(__gnu_cxx::_Lock_policy)2>;
      p_Var3 != p_Var1; p_Var3 = p_Var3 + 1) {
    std::__shared_ptr<miniros::Publication,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&t.super___shared_ptr<miniros::Publication,_(__gnu_cxx::_Lock_policy)2>,p_Var3);
    pub._type = TypeInvalid;
    pub._value.asDouble = 0.0;
    XmlRpc::XmlRpcValue::XmlRpcValue
              (&local_40,
               &(t.super___shared_ptr<miniros::Publication,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                name_);
    pXVar2 = XmlRpc::XmlRpcValue::operator[](&pub,0);
    XmlRpc::XmlRpcValue::operator=(pXVar2,&local_40);
    XmlRpc::XmlRpcValue::~XmlRpcValue(&local_40);
    XmlRpc::XmlRpcValue::XmlRpcValue
              (&local_40,
               &(t.super___shared_ptr<miniros::Publication,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                datatype_);
    pXVar2 = XmlRpc::XmlRpcValue::operator[](&pub,1);
    XmlRpc::XmlRpcValue::operator=(pXVar2,&local_40);
    XmlRpc::XmlRpcValue::~XmlRpcValue(&local_40);
    pXVar2 = XmlRpc::XmlRpcValue::operator[](pubs,i);
    XmlRpc::XmlRpcValue::operator=(pXVar2,&pub);
    XmlRpc::XmlRpcValue::~XmlRpcValue(&pub);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&t.super___shared_ptr<miniros::Publication,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    i = i + 1;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->advertised_topics_mutex_);
  return;
}

Assistant:

void TopicManager::getPublications(XmlRpcValue& pubs)
{
  // force these guys to be arrays, even if we don't populate them
  pubs.setSize(0);

  {
    std::scoped_lock<std::recursive_mutex> lock(advertised_topics_mutex_);

    uint32_t sidx = 0;

    for (PublicationPtr t: advertised_topics_) {
      XmlRpcValue pub;
      pub[0] = t->getName();
      pub[1] = t->getDataType();
      pubs[sidx++] = pub;
    }
  }
}